

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

HRESULT __thiscall
Js::ScriptContext::CompileUTF8Core
          (ScriptContext *this,Parser *ps,Utf8SourceInfo *utf8SourceInfo,SRCINFO *srcInfo,
          BOOL fOriginalUTF8Code,LPCUTF8 pszSrc,size_t cbLength,ULONG grfscr,
          CompileScriptException *pse,charcount_t *cchLength,size_t *srcLength,uint *sourceIndex,
          ParseableFunctionInfo **func,SimpleDataCacheWrapper *pDataCache)

{
  charcount_t cVar1;
  SourceContextInfo *sourceContextInfo;
  long lVar2;
  code *pcVar3;
  ParseNodeProg *sourceInfo;
  bool bVar4;
  bool bVar5;
  HRESULT HVar6;
  uint sourceIndex_00;
  undefined4 *puVar7;
  char *cbLength_00;
  int extraout_EDX;
  int extraout_EDX_00;
  int cchLength_00;
  LPCUTF8 extraout_RDX;
  LPCUTF8 extraout_RDX_00;
  LPCUTF8 pszSrc_00;
  ULONG UVar8;
  char *this_00;
  SRCINFO *srcInfo_00;
  ParseableFunctionInfo *func_00;
  ParseNodeProg *parserStateCacheBuffer;
  DWORD parserStateCacheByteCount;
  ScriptContext *local_40;
  ParseNodeProg *parseTree;
  
  bVar5 = false;
  *func = (ParseableFunctionInfo *)0x0;
  *srcLength = (ulong)*cchLength;
  local_40 = (ScriptContext *)0x0;
  sourceContextInfo = (srcInfo->sourceContextInfo).ptr;
  parseTree = (ParseNodeProg *)utf8SourceInfo;
  if ((((grfscr >> 8 & 1) != 0) && (bVar5 = false, pDataCache != (SimpleDataCacheWrapper *)0x0)) &&
     (DAT_015962e9 != '\0')) {
    bVar5 = IsScriptContextInDebugMode(this);
    if (bVar5) {
      bVar5 = false;
    }
    else {
      CalculateCRC(0,cbLength,pszSrc);
      *func = (ParseableFunctionInfo *)0x0;
      bVar5 = true;
    }
  }
  if (fOriginalUTF8Code == 0) {
    HVar6 = Parser::ParseCesu8Source
                      (ps,(ParseNodeProg **)&local_40,pszSrc,cbLength,grfscr,pse,
                       &sourceContextInfo->nextLocalFunctionId,sourceContextInfo);
    cchLength_00 = extraout_EDX_00;
  }
  else {
    HVar6 = Parser::ParseUtf8Source
                      (ps,(ParseNodeProg **)&local_40,pszSrc,cbLength,grfscr,pse,
                       &sourceContextInfo->nextLocalFunctionId,sourceContextInfo);
    cVar1 = ps->m_sourceLim;
    *cchLength = cVar1;
    (parseTree->super_ParseNodeFnc).super_ParseNode.ichLim = cVar1;
    cchLength_00 = extraout_EDX;
  }
  sourceInfo = parseTree;
  (parseTree->super_ParseNodeFnc).functionId = grfscr;
  *srcLength = ps->m_length;
  if (-1 < HVar6) {
    parseTree = (ParseNodeProg *)ps;
    sourceIndex_00 =
         SaveSourceNoCopy(this,(Utf8SourceInfo *)sourceInfo,cchLength_00,fOriginalUTF8Code == 0);
    this_00 = (char *)local_40;
    *sourceIndex = sourceIndex_00;
    bVar4 = IsScriptContextInSourceRundownOrDebugMode(this);
    srcInfo_00 = (SRCINFO *)(ulong)sourceIndex_00;
    cbLength_00 = (char *)func;
    UVar8 = grfscr;
    parserStateCacheBuffer = parseTree;
    HVar6 = GenerateByteCode((ParseNodeProg *)this_00,grfscr,this,func,sourceIndex_00,
                             (bool)(bVar4 & (this->config).NoNative),(Parser *)parseTree,pse,
                             (ScopeInfo *)0x0,(ScriptFunction **)0x0);
    parserStateCacheByteCount = (DWORD)pse;
    (sourceInfo->super_ParseNodeFnc).deferredParseNextFunctionId = grfscr;
    if (-1 < HVar6) {
      if (!bVar5) {
        return HVar6;
      }
      func_00 = *func;
      pszSrc_00 = extraout_RDX;
      if (func_00 == (ParseableFunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        this_00 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
        ;
        cbLength_00 = "*func != nullptr";
        UVar8 = 0x9b1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0x9b1,"(*func != nullptr)","*func != nullptr");
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
        func_00 = *func;
        pszSrc_00 = extraout_RDX_00;
      }
      TrySerializeParserState
                ((ScriptContext *)this_00,UVar8,pszSrc_00,(size_t)cbLength_00,srcInfo_00,func_00,
                 (byte *)parserStateCacheBuffer,parserStateCacheByteCount,pDataCache);
      return HVar6;
    }
  }
  bVar5 = IsScriptContextInDebugMode(this);
  if (((bVar5) && (UVar8 = (sourceInfo->super_ParseNodeFnc).lineNumber, (UVar8 & 4) == 0)) &&
     ((lVar2._0_4_ = (sourceInfo->super_ParseNodeFnc).fncFlags,
      lVar2._4_4_ = (sourceInfo->super_ParseNodeFnc).astSize, (UVar8 & 0x40) == 0 ||
      ((UVar8 & 0x20) == 0 && lVar2 == 0)))) {
    Utf8SourceInfo::SetInDebugMode((Utf8SourceInfo *)sourceInfo,true);
  }
  return HVar6;
}

Assistant:

HRESULT ScriptContext::CompileUTF8Core(
        __in Parser& ps,
        __in Js::Utf8SourceInfo* utf8SourceInfo,
        __in SRCINFO *srcInfo,
        __in BOOL fOriginalUTF8Code,
        _In_reads_bytes_(cbLength) LPCUTF8 pszSrc,
        __in size_t cbLength,
        __in ULONG grfscr,
        __in CompileScriptException *pse,
        __inout charcount_t& cchLength,
        __out size_t& srcLength,
        __out uint& sourceIndex,
        __deref_out Js::ParseableFunctionInfo ** func,
        __in_opt Js::SimpleDataCacheWrapper* pDataCache
    )
    {
        HRESULT hr = E_FAIL;
        (*func) = nullptr;
        srcLength = cchLength;

        bool isCesu8 = !fOriginalUTF8Code;
        ParseNodeProg * parseTree = nullptr;
        SourceContextInfo * sourceContextInfo = srcInfo->sourceContextInfo;
        bool fUseParserStateCache = ((grfscr & fscrCreateParserState) == fscrCreateParserState)
            && CONFIG_FLAG(ParserStateCache)
            && pDataCache != nullptr
            && !this->IsScriptContextInDebugMode();
        byte* parserStateCacheBuffer = nullptr;
        DWORD parserStateCacheByteCount = 0;
        uint computedSourceCRC = 0;

        if (fUseParserStateCache)
        {
            computedSourceCRC = CalculateCRC(0, cbLength, (void*)pszSrc);
            hr = TryDeserializeParserState(grfscr, computedSourceCRC, cchLength, srcInfo, utf8SourceInfo, sourceIndex, isCesu8, nullptr, func, &parserStateCacheBuffer, &parserStateCacheByteCount, pDataCache);
#ifdef ENABLE_WININET_PROFILE_DATA_CACHE
            // ERROR_WRITE_PROTECT indicates we cannot cache this script for whatever reason.
            // Disable generating and serializing the parser state cache.
            if (hr == HRESULT_FROM_WIN32(ERROR_WRITE_PROTECT))
            {
                fUseParserStateCache = false;
                grfscr &= ~fscrCreateParserState;
            }
#endif
        }

        // If hydrating the parser state cache failed, let's try to do an ordinary parse
        if (FAILED(hr) || *func == nullptr)
        {
            if (fOriginalUTF8Code)
            {
                hr = ps.ParseUtf8Source(&parseTree, pszSrc, cbLength, grfscr, pse, &sourceContextInfo->nextLocalFunctionId,
                    sourceContextInfo);
                cchLength = ps.GetSourceIchLim();

                // Correcting total number of characters.
                utf8SourceInfo->SetCchLength(cchLength);
            }
            else
            {
                hr = ps.ParseCesu8Source(&parseTree, pszSrc, cbLength, grfscr, pse, &sourceContextInfo->nextLocalFunctionId,
                    sourceContextInfo);
            }

            utf8SourceInfo->SetParseFlags(grfscr);
            srcLength = ps.GetSourceLength();

            if (SUCCEEDED(hr))
            {
                sourceIndex = this->SaveSourceNoCopy(utf8SourceInfo, cchLength, isCesu8);
                hr = GenerateByteCode(parseTree, grfscr, this, func, sourceIndex, this->IsForceNoNative(), &ps, pse);
                utf8SourceInfo->SetByteCodeGenerationFlags(grfscr);
            }
        }

        if (SUCCEEDED(hr))
        {
            // If we are supposed to create a parser state cache, do that now since we have the generated code and the parser available.
            // Note: We do need to serialze the parser state cache again even if we just deserialized it because the data cache will
            // persist whatever we write into it and it starts empty.
            if (fUseParserStateCache)
            {
                Assert(*func != nullptr);
                TrySerializeParserState(computedSourceCRC, pszSrc, cbLength, srcInfo, *func, parserStateCacheBuffer, parserStateCacheByteCount, pDataCache);
            }
        }
#ifdef ENABLE_SCRIPT_DEBUGGING
        else if (this->IsScriptContextInDebugMode() && !utf8SourceInfo->GetIsLibraryCode() && !utf8SourceInfo->IsInDebugMode())
        {
            // In case of syntax error, if we are in debug mode, put the utf8SourceInfo into debug mode.
            utf8SourceInfo->SetInDebugMode(true);
        }
#endif

        return hr;
    }